

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

mi_heap_t * mi_heap_new_ex(int heap_tag,_Bool allow_destroy,mi_arena_id_t arena_id)

{
  mi_heap_t *heap;
  mi_heap_t *heap_00;
  long in_FS_OFFSET;
  
  mi_thread_init();
  heap = *(mi_heap_t **)(**(long **)(in_FS_OFFSET + -0x28) + 0x10);
  heap_00 = (mi_heap_t *)mi_heap_malloc(heap,0xc08);
  if (heap_00 == (mi_heap_t *)0x0) {
    heap_00 = (mi_heap_t *)0x0;
  }
  else {
    _mi_heap_init(heap_00,heap->tld,arena_id,allow_destroy,(uint8_t)heap_tag);
  }
  return heap_00;
}

Assistant:

mi_decl_nodiscard mi_heap_t* mi_heap_new_ex(int heap_tag, bool allow_destroy, mi_arena_id_t arena_id) {
  mi_heap_t* bheap = mi_heap_get_backing();
  mi_heap_t* heap = mi_heap_malloc_tp(bheap, mi_heap_t);  // todo: OS allocate in secure mode?
  if (heap == NULL) return NULL;
  mi_assert(heap_tag >= 0 && heap_tag < 256);
  _mi_heap_init(heap, bheap->tld, arena_id, allow_destroy /* no reclaim? */, (uint8_t)heap_tag /* heap tag */);
  return heap;
}